

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_functions.h
# Opt level: O1

void output_vec<std::vector<unsigned_int,std::allocator<unsigned_int>>>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,ostream *stream)

{
  ostream *poVar1;
  pointer puVar2;
  
  puVar2 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      puVar2 = puVar2 + 1;
    } while (puVar2 != (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  return;
}

Assistant:

void output_vec(T vec, std::ostream & stream=std::clog) 
{
  for (auto it = vec.begin(); it != vec.end(); ++it)
  {
    stream << *it << " ";
  }
  stream << "\n";
  return;
}